

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int32_t peek0(Env *env)

{
  uint uVar1;
  State *pSVar2;
  TSLexer *pTVar3;
  
  pSVar2 = env->state;
  uVar1 = (pSVar2->lookahead).offset;
  if (uVar1 < (pSVar2->lookahead).size) {
    pTVar3 = (TSLexer *)((pSVar2->lookahead).contents + uVar1);
  }
  else {
    advance_before(env,0);
    pTVar3 = env->lexer;
  }
  return pTVar3->lookahead;
}

Assistant:

static int32_t peek(Env *env, uint32_t rel) {
#ifdef TREE_SITTER_DEBUG
  debug_peek(env, rel);
#endif
  if (env->state->lookahead.offset + rel < env->state->lookahead.size) return unsafe_peek(env, rel);
  else {
    advance_before(env, rel);
    return PEEK;
  }
}